

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_file.cpp
# Opt level: O0

void __thiscall
foxxll::linuxaio_file::serve
          (linuxaio_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  request *prVar1;
  Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> local_98;
  undefined1 local_70 [48];
  undefined8 uStack_40;
  undefined1 local_38 [20];
  read_or_write op_local;
  size_type bytes_local;
  offset_type offset_local;
  void *buffer_local;
  linuxaio_file *this_local;
  
  local_38._12_4_ = op;
  unique0x100002cc = bytes;
  bytes_local = offset;
  offset_local = (offset_type)buffer;
  buffer_local = this;
  if (op == READ) {
    local_70._40_8_ = (__pthread_internal_list *)0x0;
    uStack_40._0_4_ = 0;
    uStack_40._4_4_ = 0;
    local_70._24_8_ = 0;
    local_70._32_8_ = (__pthread_internal_list *)0x0;
    tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::Delegate
              ((Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> *)(local_70 + 0x18))
    ;
    aread((linuxaio_file *)local_38,this,(offset_type)buffer,offset,(completion_handler *)bytes);
    prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->
                       ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_38);
    (**(code **)(*(long *)(&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68)) + 0x30))
              (&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68),1);
    tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
              ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_38);
    tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::~Delegate
              ((Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> *)(local_70 + 0x18))
    ;
  }
  else {
    local_98.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98.caller_ = (Caller)0x0;
    local_98.object_ptr_ = (void *)0x0;
    tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::Delegate(&local_98);
    awrite((linuxaio_file *)local_70,this,(offset_type)buffer,offset,(completion_handler *)bytes);
    prVar1 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->
                       ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_70);
    (**(code **)(*(long *)(&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68)) + 0x30))
              (&prVar1->field_0x0 + *(long *)(*(long *)prVar1 + -0x68),1);
    tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
              ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_70);
    tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::~Delegate(&local_98);
  }
  return;
}

Assistant:

void linuxaio_file::serve(void* buffer, offset_type offset, size_type bytes,
                          request::read_or_write op)
{
    // req need not be an linuxaio_request
    if (op == request::READ)
        aread(buffer, offset, bytes)->wait();
    else
        awrite(buffer, offset, bytes)->wait();
}